

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

bool __thiscall presolve::HPresolve::isImpliedInteger(HPresolve *this,HighsInt col)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  reference pHVar6;
  char *pcVar7;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar8;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  int __c_08;
  int extraout_EDX_01;
  int __c_09;
  int extraout_EDX_02;
  int in_ESI;
  iterator *piVar9;
  long *in_RDI;
  double dVar10;
  double scale_1;
  HighsSliceNonzero *nz_1;
  iterator __end1_1;
  iterator __begin1_1;
  HighsTripletListSlice *__range1_1;
  double scale;
  double rowUpper;
  double rowLower;
  HighsSliceNonzero *nz;
  iterator __end1;
  iterator __begin1;
  HighsTripletListSlice *__range1;
  bool runDualDetection;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe58;
  HPresolve *in_stack_fffffffffffffe60;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe88;
  HighsInt col_00;
  HPresolve *in_stack_fffffffffffffe90;
  double local_158;
  iterator local_108;
  iterator local_e8;
  undefined1 local_c8 [16];
  HighsTimer *in_stack_ffffffffffffff48;
  HighsInt in_stack_ffffffffffffff54;
  HPresolve *in_stack_ffffffffffffff58;
  HPresolve *this_00;
  iterator local_60;
  int local_40 [8];
  int *local_20;
  byte local_15;
  int local_14;
  bool local_1;
  
  local_15 = 1;
  local_14 = in_ESI;
  getColumnVector(in_stack_fffffffffffffe90,(HighsInt)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  local_20 = local_40;
  HighsMatrixSlice<HighsTripletListSlice>::begin
            ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffe60);
  HighsMatrixSlice<HighsTripletListSlice>::end
            ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffe60);
  while( true ) {
    piVar9 = (iterator *)&stack0xffffffffffffff80;
    bVar3 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_60,piVar9);
    col_00 = (HighsInt)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    if (!bVar3) break;
    pHVar6 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_60);
    pcVar7 = HighsSliceNonzero::index(pHVar6,(char *)piVar9,__c);
    pcVar7 = (char *)(long)(int)pcVar7;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(size_type)pcVar7);
    if (*pvVar4 < 2) {
LAB_006ed40b:
      local_15 = 0;
    }
    else {
      pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,__c_00);
      pcVar7 = (char *)(long)(int)pcVar7;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x23),(size_type)pcVar7);
      iVar8 = *pvVar4;
      pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,__c_01);
      pcVar7 = (char *)(long)(int)pcVar7;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x26),(size_type)pcVar7);
      iVar1 = *pvVar4;
      pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,(int)pvVar4);
      pcVar7 = (char *)(long)(int)pcVar7;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(size_type)pcVar7);
      if (iVar8 + iVar1 < *pvVar4 + -1) goto LAB_006ed40b;
      pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,__c_02);
      pcVar7 = (char *)((ulong)pcVar7 & 0xffffffff);
      bVar3 = isImpliedEquationAtUpper
                        (in_stack_fffffffffffffe60,
                         (HighsInt)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      if (bVar3) {
        lVar2 = *in_RDI;
        pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,__c_03);
        pcVar7 = (char *)(long)(int)pcVar7;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x68),
                            (size_type)pcVar7);
        local_158 = *pvVar5;
        iVar8 = extraout_EDX;
      }
      else {
        lVar2 = *in_RDI;
        pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,__c_03);
        pcVar7 = (char *)(long)(int)pcVar7;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x50),
                            (size_type)pcVar7);
        local_158 = *pvVar5;
        iVar8 = extraout_EDX_00;
      }
      pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,iVar8);
      pcVar7 = (char *)((ulong)pcVar7 & 0xffffffff);
      bVar3 = isImpliedEquationAtLower
                        (in_stack_fffffffffffffe60,
                         (HighsInt)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      if (bVar3) {
        in_stack_fffffffffffffe88 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50);
        pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,__c_04);
        pcVar7 = (char *)(long)(int)pcVar7;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_fffffffffffffe88,(size_type)pcVar7);
        in_stack_fffffffffffffe90 = (HPresolve *)*pvVar5;
      }
      else {
        lVar2 = *in_RDI;
        pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,__c_04);
        pcVar7 = (char *)(long)(int)pcVar7;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x68),
                            (size_type)pcVar7);
        in_stack_fffffffffffffe90 = (HPresolve *)*pvVar5;
      }
      if (((double)in_stack_fffffffffffffe90 == local_158) &&
         (!NAN((double)in_stack_fffffffffffffe90) && !NAN(local_158))) {
        local_15 = 0;
        HighsSliceNonzero::value(pHVar6);
        lVar2 = *in_RDI;
        pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,__c_05);
        pcVar7 = (char *)(long)(int)pcVar7;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x50),(size_type)pcVar7);
        dVar10 = fractionality<double>
                           ((double)in_stack_fffffffffffffe60,(double *)in_stack_fffffffffffffe58);
        if (dVar10 < (double)in_RDI[4] || dVar10 == (double)in_RDI[4]) {
          HighsSliceNonzero::index(pHVar6,pcVar7,__c_06);
          bVar3 = rowCoefficientsIntegral
                            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                             (double)in_stack_ffffffffffffff48);
          if (bVar3) {
            return true;
          }
        }
      }
    }
    HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_60);
  }
  if ((local_15 & 1) == 0) {
    return false;
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_14);
  if ((*pvVar5 != -INFINITY) || (NAN(*pvVar5))) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_14);
    dVar10 = fractionality<double>
                       ((double)in_stack_fffffffffffffe60,(double *)in_stack_fffffffffffffe58);
    if (dVar10 < *(double *)(in_RDI[1] + 0x108) || dVar10 == *(double *)(in_RDI[1] + 0x108))
    goto LAB_006ed6d2;
LAB_006ed743:
    local_1 = false;
  }
  else {
LAB_006ed6d2:
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_14);
    if ((*pvVar5 != INFINITY) || (NAN(*pvVar5))) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_14);
      dVar10 = fractionality<double>
                         ((double)in_stack_fffffffffffffe60,(double *)in_stack_fffffffffffffe58);
      if (*(double *)(in_RDI[1] + 0x108) <= dVar10 && dVar10 != *(double *)(in_RDI[1] + 0x108))
      goto LAB_006ed743;
    }
    getColumnVector(in_stack_fffffffffffffe90,col_00);
    this_00 = (HPresolve *)local_c8;
    HighsMatrixSlice<HighsTripletListSlice>::begin
              ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffe60);
    HighsMatrixSlice<HighsTripletListSlice>::end
              ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffe60);
    while( true ) {
      piVar9 = &local_108;
      bVar3 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_e8,piVar9);
      if (!bVar3) break;
      pHVar6 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_e8);
      HighsSliceNonzero::value(pHVar6);
      lVar2 = *in_RDI;
      pcVar7 = HighsSliceNonzero::index(pHVar6,(char *)piVar9,__c_07);
      pcVar7 = (char *)(long)(int)pcVar7;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x68),
                          (size_type)pcVar7);
      if ((*pvVar5 != INFINITY) || (iVar8 = __c_08, NAN(*pvVar5))) {
        lVar2 = *in_RDI;
        pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,__c_08);
        pcVar7 = (char *)(long)(int)pcVar7;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x68),(size_type)pcVar7);
        dVar10 = fractionality<double>
                           ((double)in_stack_fffffffffffffe60,(double *)in_stack_fffffffffffffe58);
        iVar8 = extraout_EDX_01;
        if ((double)in_RDI[4] <= dVar10 && dVar10 != (double)in_RDI[4]) {
          return false;
        }
      }
      in_stack_fffffffffffffe60 = (HPresolve *)(*in_RDI + 0x50);
      pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,iVar8);
      pcVar7 = (char *)(long)(int)pcVar7;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60,
                          (size_type)pcVar7);
      if ((*pvVar5 != -INFINITY) || (iVar8 = __c_09, NAN(*pvVar5))) {
        in_stack_fffffffffffffe58 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50);
        pcVar7 = HighsSliceNonzero::index(pHVar6,pcVar7,__c_09);
        pcVar7 = (char *)(long)(int)pcVar7;
        std::vector<double,_std::allocator<double>_>::operator[]
                  (in_stack_fffffffffffffe58,(size_type)pcVar7);
        dVar10 = fractionality<double>
                           ((double)in_stack_fffffffffffffe60,(double *)in_stack_fffffffffffffe58);
        iVar8 = extraout_EDX_02;
        if ((double)in_RDI[4] <= dVar10 && dVar10 != (double)in_RDI[4]) {
          return false;
        }
      }
      HighsSliceNonzero::index(pHVar6,pcVar7,iVar8);
      bVar3 = rowCoefficientsIntegral
                        (this_00,in_stack_ffffffffffffff54,(double)in_stack_ffffffffffffff48);
      if (!bVar3) {
        return false;
      }
      HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_e8);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool HPresolve::isImpliedInteger(HighsInt col) {
  // check if a continuous variable is implied integer
  assert(model->integrality_[col] == HighsVarType::kContinuous);

  bool runDualDetection = true;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    // if not all other columns are integer, skip row and also do not try the
    // dual detection in the second loop as it must hold for all rows
    if (rowsize[nz.index()] < 2 ||
        rowsizeInteger[nz.index()] + rowsizeImplInt[nz.index()] <
            rowsize[nz.index()] - 1) {
      runDualDetection = false;
      continue;
    }

    double rowLower = isImpliedEquationAtUpper(nz.index())
                          ? model->row_upper_[nz.index()]
                          : model->row_lower_[nz.index()];

    double rowUpper = isImpliedEquationAtLower(nz.index())
                          ? model->row_lower_[nz.index()]
                          : model->row_upper_[nz.index()];

    if (rowUpper == rowLower) {
      // if there is an equation the dual detection does not need to be tried
      runDualDetection = false;
      double scale = 1.0 / nz.value();

      if (fractionality(model->row_lower_[nz.index()] * scale) >
          primal_feastol) {
        continue;
      }

      if (!rowCoefficientsIntegral(nz.index(), scale)) continue;

      return true;
    }
  }

  if (!runDualDetection) return false;

  if ((model->col_lower_[col] != -kHighsInf &&
       fractionality(model->col_lower_[col]) > options->small_matrix_value) ||
      (model->col_upper_[col] != kHighsInf &&
       fractionality(model->col_upper_[col]) > options->small_matrix_value))
    return false;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    double scale = 1.0 / nz.value();
    if (model->row_upper_[nz.index()] != kHighsInf &&
        fractionality(model->row_upper_[nz.index()] * scale) > primal_feastol)
      return false;

    if (model->row_lower_[nz.index()] != -kHighsInf &&
        fractionality(model->row_lower_[nz.index()] * scale) > primal_feastol)
      return false;

    if (!rowCoefficientsIntegral(nz.index(), scale)) return false;
  }

  return true;
}